

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O3

void __thiscall
MuxerManager::MuxerManager
          (MuxerManager *this,BufferedReaderManager *readManager,AbstractMuxerFactory *factory)

{
  _Rb_tree_header *p_Var1;
  
  (this->m_outFileName)._M_dataplus._M_p = (pointer)&(this->m_outFileName).field_2;
  (this->m_outFileName)._M_string_length = 0;
  (this->m_outFileName).field_2._M_local_buf[0] = '\0';
  std::condition_variable::condition_variable(&this->reinitCond);
  METADemuxer::METADemuxer(&this->m_metaDemuxer,readManager);
  this->m_factory = factory;
  p_Var1 = &(this->m_subStreamIndex)._M_t._M_impl.super__Rb_tree_header;
  (this->m_subStreamIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_subStreamIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_subStreamIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_subStreamIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_subStreamIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_muxOpts)._M_dataplus._M_p = (pointer)&(this->m_muxOpts).field_2;
  (this->m_muxOpts)._M_string_length = 0;
  (this->m_muxOpts).field_2._M_local_buf[0] = '\0';
  (this->m_delayedData).super__Vector_base<WriterData,_std::allocator<WriterData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_delayedData).super__Vector_base<WriterData,_std::allocator<WriterData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_delayedData).super__Vector_base<WriterData,_std::allocator<WriterData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_reproducibleIsoHeader = false;
  this->m_asyncMode = true;
  this->m_allowStereoMux = false;
  this->m_interleave = false;
  this->m_subBlockFinished = false;
  this->m_mainBlockFinished = false;
  this->m_mainMuxer = (AbstractMuxer *)0x0;
  this->m_subMuxer = (AbstractMuxer *)0x0;
  this->m_cutStart = 0;
  this->m_cutEnd = 0;
  this->m_fileWriter = (BufferedFileWriter *)0x0;
  this->m_ptsOffset = 54000000;
  this->m_mvcBaseViewR = false;
  this->m_extraIsoBlocks = 0;
  this->m_bluRayMode = false;
  this->m_demuxMode = false;
  return;
}

Assistant:

MuxerManager::MuxerManager(const BufferedReaderManager& readManager, AbstractMuxerFactory& factory)
    : m_metaDemuxer(readManager), m_factory(factory)
{
    m_asyncMode = true;
    m_fileWriter = nullptr;
    m_cutStart = 0;
    m_cutEnd = 0;
    m_mainMuxer = m_subMuxer = nullptr;
    m_allowStereoMux = false;
    m_interleave = false;
    m_subBlockFinished = false;
    m_mainBlockFinished = false;
    m_ptsOffset = 54000000ll;
    m_mvcBaseViewR = false;
    m_extraIsoBlocks = 0;
    m_bluRayMode = false;
    m_demuxMode = false;
}